

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
gmath::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,SMatrix<double,_3,_3> *a)

{
  ostream *this;
  SMatrix<double,_3,_3> *in_RSI;
  ostream *in_RDI;
  double dVar1;
  int i;
  int k;
  int local_18;
  int local_14;
  
  std::operator<<(in_RDI,"[");
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    dVar1 = SMatrix<double,_3,_3>::operator()(in_RSI,local_14,0);
    std::ostream::operator<<(in_RDI,dVar1);
    for (local_18 = 1; local_18 < 3; local_18 = local_18 + 1) {
      this = std::operator<<(in_RDI," ");
      dVar1 = SMatrix<double,_3,_3>::operator()(in_RSI,local_14,local_18);
      std::ostream::operator<<(this,dVar1);
    }
    if (local_14 + 1 < 3) {
      std::operator<<(in_RDI,"; ");
    }
  }
  std::operator<<(in_RDI,"]");
  return in_RDI;
}

Assistant:

std::basic_ostream<Ch, Tr> &operator<<(std::basic_ostream<Ch, Tr> &out,
                                       const SMatrix<T, nrows, ncols> &a)
{
  out << "[";

  for (int k=0; k<nrows; k++)
  {
    out << a(k, 0);

    for (int i=1; i<ncols; i++)
    {
      out << " " << a(k, i);
    }

    if (k+1 < nrows)
    {
      out << "; ";
    }
  }

  out << "]";

  return out;
}